

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O2

NaPNEvent __thiscall NaPetriNet::step_alive(NaPetriNet *this,bool bDoPrintouts)

{
  NaPNodePtrAr *pNVar1;
  FILE *pFVar2;
  NaPetriNode *pNVar3;
  NaDataFile *pNVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  NaPNEvent NVar9;
  long lVar10;
  undefined4 extraout_var;
  char *pcVar11;
  size_t sVar12;
  undefined4 extraout_var_00;
  size_t sVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  NaPetriConnector *pNVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  char *pcVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  undefined8 uVar22;
  double dVar23;
  int local_3c;
  int local_38;
  
  bVar16 = bDoPrintouts | this->bStepPrintout;
  if (bVar16 == 1) {
    NaPrintLog("# net \'%s\', step phases 7, 8, 9.\n",this->szName);
  }
  if (this->dfTimeChart != (NaDataFile *)0x0) {
    (*this->dfTimeChart->_vptr_NaDataFile[6])();
    iVar17 = this->iPrevIndex;
    iVar7 = (*this->pTimer->_vptr_NaTimer[5])();
    uVar22 = 0;
    if (iVar17 != iVar7) {
      uVar22 = 0x3fe999999999999a;
    }
    (*this->dfTimeChart->_vptr_NaDataFile[2])(uVar22,this->dfTimeChart,0);
  }
  if (bVar16 != 0) {
    NaPrintLog("----------------------------------------\n");
  }
  if (((FILE *)this->fpMap != (FILE *)0x0) && (lVar10 = ftell((FILE *)this->fpMap), lVar10 == 0)) {
    for (iVar17 = 0; iVar17 < (this->pnaNet).nItems; iVar17 = iVar17 + 1) {
      fwrite("==",2,1,(FILE *)this->fpMap);
    }
    pNVar1 = &this->pnaNet;
    fputc(10,(FILE *)this->fpMap);
    sVar13 = 0;
    uVar21 = 0;
    while( true ) {
      iVar17 = (int)sVar13;
      if ((this->pnaNet).nItems <= (int)uVar21) break;
      iVar7 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
      pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var,iVar7));
      sVar12 = strlen(pcVar11);
      if ((ulong)(long)iVar17 < sVar12) {
        iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
        pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_00,iVar17));
        sVar13 = strlen(pcVar11);
      }
      uVar21 = (ulong)((int)uVar21 + 1);
    }
    iVar7 = 0;
    if (0 < iVar17) {
      iVar7 = iVar17;
    }
    for (iVar18 = 0; iVar18 != iVar7; iVar18 = iVar18 + 1) {
      for (uVar21 = 0; (int)uVar21 < (this->pnaNet).nItems; uVar21 = (ulong)((int)uVar21 + 1)) {
        iVar8 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,uVar21);
        pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_01,iVar8));
        sVar13 = strlen(pcVar11);
        pFVar2 = (FILE *)this->fpMap;
        if ((int)sVar13 + iVar18 < iVar17) {
          fwrite("  ",2,1,pFVar2);
        }
        else {
          iVar8 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
          pcVar11 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_02,iVar8));
          fprintf(pFVar2," %c",(ulong)(uint)(int)pcVar11[(int)sVar13 + (iVar18 - iVar17)]);
        }
      }
      fputc(10,(FILE *)this->fpMap);
    }
    for (iVar17 = 0; iVar17 < (this->pnaNet).nItems; iVar17 = iVar17 + 1) {
      fwrite("--",2,1,(FILE *)this->fpMap);
    }
    fputc(10,(FILE *)this->fpMap);
  }
  pNVar1 = &this->pnaNet;
  local_38 = 0;
  local_3c = 0;
  uVar20 = 0;
  do {
    uVar19 = uVar20;
    if ((this->pnaNet).nItems <= (int)uVar19) {
      if ((FILE *)this->fpMap != (FILE *)0x0) {
        fputc(10,(FILE *)this->fpMap);
      }
      if (local_38 == 0) {
        NVar9 = pneDead;
      }
      else if (local_3c == 0) {
        NVar9 = (uint)bUserBreak + (uint)bUserBreak * 2;
      }
      else {
        NVar9 = pneHalted;
      }
      return NVar9;
    }
    uVar21 = (ulong)uVar19;
    iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar19);
    pNVar3 = *(NaPetriNode **)CONCAT44(extraout_var_03,iVar17);
    iVar17 = NaPetriNode::connectors(pNVar3);
    if (iVar17 == 0) {
      if ((bVar16 == 0) && (iVar17 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3), (char)iVar17 == '\0'))
      {
        cVar5 = '\0';
      }
      else {
        pcVar11 = NaPetriNode::name(pNVar3);
        cVar5 = '\0';
        NaPrintLog("node \'%s\' does not have connectors: skip it.\n",pcVar11);
      }
    }
    else {
      if ((bVar16 != 0) || (iVar17 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3), (char)iVar17 != '\0'))
      {
        pcVar11 = NaPetriNode::name(pNVar3);
        NaPrintLog("node \'%s\' try to activate.\n",pcVar11);
      }
      iVar17 = (*pNVar3->_vptr_NaPetriNode[0x11])(pNVar3);
      cVar5 = (char)iVar17;
      pNVar3->nCalls = pNVar3->nCalls + 1;
      if ((bVar16 != 0) || (iVar17 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3), (char)iVar17 != '\0'))
      {
        pcVar11 = NaPetriNode::name(pNVar3);
        pcVar15 = "not ";
        if (cVar5 != '\0') {
          pcVar15 = "";
        }
        NaPrintLog("node \'%s\' is %sactivated.\n",pcVar11,pcVar15);
      }
    }
    pFVar2 = (FILE *)this->fpMap;
    if (pFVar2 == (FILE *)0x0) {
      if (cVar5 != '\0') goto LAB_001462b3;
    }
    else if (cVar5 == '\0') {
      fwrite("  ",2,1,pFVar2);
    }
    else {
      fwrite(" a",2,1,pFVar2);
LAB_001462b3:
      iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
      pNVar3 = *(NaPetriNode **)CONCAT44(extraout_var_04,iVar17);
      if ((bVar16 != 0) || (iVar17 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3), (char)iVar17 != '\0'))
      {
        pcVar11 = NaPetriNode::name(pNVar3);
        NaPrintLog("node \'%s\' action.\n",pcVar11);
      }
      iVar17 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
      if ((char)iVar17 != '\0') {
        pcVar11 = NaPetriNode::name(pNVar3);
        NaPrintLog("node \'%s\', input data:\n",pcVar11);
        for (iVar17 = 0; iVar7 = NaPetriNode::connectors(pNVar3), iVar17 < iVar7;
            iVar17 = iVar17 + 1) {
          pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
          iVar7 = (*pNVar14->_vptr_NaPetriConnector[2])(pNVar14);
          if (0 < iVar7) {
            pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
            iVar7 = (*pNVar14->_vptr_NaPetriConnector[7])(pNVar14);
            if (iVar7 == 0) {
              pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
              pcVar11 = NaPetriConnector::name(pNVar14);
              NaPrintLog("  #%d \'%s\': ",(ulong)(iVar17 + 1),pcVar11);
              pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
              iVar7 = (*pNVar14->_vptr_NaPetriConnector[8])(pNVar14);
              (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0xf8))
                        ((long *)CONCAT44(extraout_var_05,iVar7));
            }
          }
        }
      }
      (*pNVar3->_vptr_NaPetriNode[0x12])(pNVar3);
      iVar17 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3);
      if ((char)iVar17 != '\0') {
        pcVar11 = NaPetriNode::name(pNVar3);
        NaPrintLog("node \'%s\', output data:\n",pcVar11);
        for (iVar17 = 0; iVar7 = NaPetriNode::connectors(pNVar3), iVar17 < iVar7;
            iVar17 = iVar17 + 1) {
          pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
          iVar7 = (*pNVar14->_vptr_NaPetriConnector[2])(pNVar14);
          if (0 < iVar7) {
            pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
            iVar7 = (*pNVar14->_vptr_NaPetriConnector[7])(pNVar14);
            if (iVar7 == 1) {
              pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
              pcVar11 = NaPetriConnector::name(pNVar14);
              NaPrintLog("  #%d \'%s\': ",(ulong)(iVar17 + 1),pcVar11);
              pNVar14 = NaPetriNode::connector(pNVar3,iVar17);
              iVar7 = (*pNVar14->_vptr_NaPetriConnector[8])(pNVar14);
              (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0xf8))
                        ((long *)CONCAT44(extraout_var_06,iVar7));
            }
          }
        }
      }
      pNVar3->nActivations = pNVar3->nActivations + 1;
      iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar19);
      if (*(NaPetriNode **)CONCAT44(extraout_var_07,iVar17) == this->pTimingNode) {
        (*this->pTimer->_vptr_NaTimer[3])();
      }
      iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
      pNVar3 = *(NaPetriNode **)CONCAT44(extraout_var_08,iVar17);
      if ((bVar16 != 0) || (iVar17 = (*pNVar3->_vptr_NaPetriNode[3])(pNVar3), (char)iVar17 != '\0'))
      {
        pcVar11 = NaPetriNode::name(pNVar3);
        NaPrintLog("node \'%s\' post action.\n",pcVar11);
      }
      (*pNVar3->_vptr_NaPetriNode[0x13])(pNVar3);
      local_38 = local_38 + 1;
      iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
      local_3c = local_3c + (uint)*(byte *)(*(long *)CONCAT44(extraout_var_09,iVar17) + 0x38);
    }
    if (bVar16 == 0) {
      iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
      cVar6 = (**(code **)(**(long **)CONCAT44(extraout_var_10,iVar17) + 0x18))();
      if (cVar6 != '\0') goto LAB_00146519;
    }
    else {
LAB_00146519:
      iVar17 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar21);
      (**(code **)(**(long **)CONCAT44(extraout_var_11,iVar17) + 0x38))();
    }
    pNVar4 = this->dfTimeChart;
    uVar20 = uVar19 + 1;
    if (pNVar4 != (NaDataFile *)0x0) {
      dVar23 = (double)(int)~uVar19 + 0.8;
      if (cVar5 == '\0') {
        dVar23 = (double)(int)~uVar19;
      }
      (*pNVar4->_vptr_NaDataFile[2])(dVar23,pNVar4,(ulong)uVar20);
    }
  } while( true );
}

Assistant:

NaPNEvent
NaPetriNet::step_alive (bool bDoPrintouts)
{
    int     iNode;
    int     nHalted = 0;
    int     iActive = 0;

    if(bStepPrintout)
      bDoPrintouts = bStepPrintout;

    if(bDoPrintouts){
        NaPrintLog("# net '%s', step phases 7, 8, 9.\n", name());
    }

    // Add point to timechart
    if(NULL != dfTimeChart){
        dfTimeChart->AppendRecord();

        // Time track
        if(iPrevIndex == timer().CurrentIndex()){
            dfTimeChart->SetValue(0.0/* old */, 0/* time */);
        }else{
            dfTimeChart->SetValue(0.8/* new */, 0/* time */);
        }
    }

    if(bDoPrintouts)
      NaPrintLog("----------------------------------------\n");

    if(NULL != fpMap){
      if(0 == ftell(fpMap)){

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "==");
	}/* iNode */
	fputc('\n', fpMap);

	/* compute max length among names */
	int	nMaxLen = 0;

	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  if(strlen(pnaNet[iNode]->name()) > nMaxLen){
	    nMaxLen = strlen(pnaNet[iNode]->name());
	  }
	}/* iNode */

	int	iLine;

	/* print header */
	for(iLine = 0; iLine < nMaxLen; ++iLine){
	  for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	    int	iNameLen = strlen(pnaNet[iNode]->name());
	    if(iNameLen + iLine >= nMaxLen){
	      fprintf(fpMap, " %c",
		      pnaNet[iNode]->name()[iLine - (nMaxLen - iNameLen)]);
	    }else{
	      fprintf(fpMap, "  ");
	    }
	  }/* iNode */
	  fputc('\n', fpMap);
	}/* iLine */

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "--");
	}/* iNode */
	fputc('\n', fpMap);

      }/* for the first time */
    }/* activation map */

    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
      bool    bActivate = false;

      try{
	NaPetriNode &node = *pnaNet[iNode];

	// 7. Do one step of node activity and return true if succeeded
	if(0 == node.connectors()) {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' does not have connectors: skip it.\n",
			   node.name());
	    }
	}
	else {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' try to activate.\n",
			   node.name());
	    }

	    bActivate = node.activate();

	    // Count calls
	    ++node.nCalls;

	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' is %sactivated.\n",
			   node.name(), bActivate?"" :"not ");
	    }
	}
      }catch(NaException exCode){
	NaPrintLog("Step of node activity phase (#7): node '%s' fault.\n"
		   "Caused by exception: %s\n",
		   pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	bActivate = false;
      }

      /* activation map */
      if(NULL != fpMap){
	if(bActivate){
	  fprintf(fpMap, " a");
	}else{
	  fprintf(fpMap, "  ");
	}
      }/* activation map */

      if(bActivate){
	++iActive;

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 8. True action of the node (if activate returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' action.\n", node.name());
	  }

	  // Print contents of linked inputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', input data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckInput){
		// Only used input connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  node.action();

	  // Print contents of linked outputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', output data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckOutput){
		// Only used output connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  // Count activations
	  ++node.nActivations;

	  // Node is timing one - let's update timer
	  if(pnaNet[iNode] == pTimingNode)
	      timer().GoNextTime();

	}catch(NaException exCode){
	  NaPrintLog("True action phase (#8): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 9. Finish data processing by the node (if activate
	  //    returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' post action.\n",
		       node.name());
	  }
	  node.post_action();
	}catch(NaException exCode){
	  NaPrintLog("Postaction phase (#9): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	// Check for internal halt
	if(pnaNet[iNode]->bHalt){
	  ++nHalted;
	}
      }

      try{
	if(bDoPrintouts || pnaNet[iNode]->is_verbose()){
	  pnaNet[iNode]->describe();
	}
      }catch(NaException exCode){
	// Skip...
      }

      // Add node point to time chart
      if(NULL != dfTimeChart){
	if(bActivate){
	  dfTimeChart->SetValue(-(1 + iNode) + 0.8/* active */, 1+iNode);
	}else{
	  dfTimeChart->SetValue(-(1 + iNode)/* passive */, 1+iNode);
	}
      }
    }

    /* activation map */
    if(NULL != fpMap){
      fputc('\n', fpMap);
    }

    //// Add point to timechart
    //if(NULL != dfTimeChart){
    //    dfTimeChart->AppendRecord();
    //
    //    // Time track
    //    dfTimeChart->SetValue(0.0/* old */, 0/* time */);
    //}

    if(0 == iActive){
        return pneDead;
    }else if(0 != nHalted){
        return pneHalted;
    }

#if defined(unix)
    if(bUserBreak)
      return pneTerminate;
#endif /* unix */

    return pneAlive;
}